

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

void __thiscall
gl4cts::EnhancedLayouts::VaryingComponentsTest::prepareShaderStage
          (VaryingComponentsTest *this,STAGES stage,Type *vector_type,
          ProgramInterface *program_interface,testCase *test_case,
          VaryingPassthrough *varying_passthrough)

{
  VaryingComponentsTest *pVVar1;
  GLuint GVar2;
  GLuint last_in_location;
  GLuint last_out_location;
  ShaderInterface *si;
  Variable *in;
  Variable *out;
  char *pcVar3;
  GLchar **ppGVar4;
  char **ppcVar5;
  descriptor *desc;
  descriptor *desc_00;
  VaryingComponentsTest *this_00;
  GLint *pGVar6;
  char **ppcVar7;
  char *pcVar8;
  undefined4 uVar9;
  GLchar **ppGVar10;
  GLuint *pGVar11;
  long lVar12;
  undefined4 *puVar13;
  descriptor *in_desc;
  GLchar **ppGVar14;
  descriptor desc_in [8];
  char **local_3a0;
  GLuint *local_398;
  GLuint *local_390;
  descriptor local_1f8;
  undefined4 local_1c8 [2];
  char *local_1c0;
  GLuint local_1b8 [2];
  char *local_1b0;
  GLuint local_1a8 [2];
  char *local_1a0;
  undefined4 local_198;
  char *local_190;
  GLint local_188 [2];
  char *local_180;
  GLuint local_178 [2];
  char *local_170;
  undefined4 local_168 [2];
  char *local_160;
  GLuint local_158 [2];
  char *local_150;
  GLuint local_148 [2];
  char *local_140;
  undefined4 local_138;
  char *local_130;
  GLint local_128 [2];
  char *local_120;
  GLuint local_118 [2];
  char *local_110;
  undefined4 local_108 [2];
  char *local_100;
  GLuint local_f8 [2];
  char *local_f0;
  GLuint local_e8 [2];
  char *local_e0;
  undefined4 local_d8;
  GLchar *local_d0;
  GLint local_c8 [2];
  GLchar *local_c0;
  GLuint local_b8 [2];
  GLchar *local_b0;
  undefined4 local_a8 [2];
  char *local_a0;
  GLuint local_98 [2];
  char *local_90;
  GLuint local_88 [2];
  char *local_80 [2];
  bool *local_70;
  VaryingPassthrough *local_68;
  _func_int **local_60;
  undefined4 local_58;
  _Alloc_hider local_50;
  undefined8 local_40;
  
  desc_00 = (descriptor *)&stack0xfffffffffffffc48;
  pVVar1 = (VaryingComponentsTest *)(ulong)stage;
  local_68 = varying_passthrough;
  GVar2 = (**(code **)((long)(this->super_VaryingLocationsTest).super_TextureTestBase.super_TestBase
                             .super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 0x110))
                    ();
  local_60 = (_func_int **)((ulong)vector_type->m_basic_type | 0x100000000);
  local_58 = 1;
  last_in_location = TestBase::getLastInputLocation((TestBase *)this,stage,vector_type,GVar2);
  this_00 = pVVar1;
  si = Utils::ProgramInterface::GetShaderInterface(program_interface,stage);
  local_70 = ::glcts::fixed_sample_locations_values + 1;
  if ((stage & ~VERTEX) == GEOMETRY) {
    local_70 = (bool *)0x1a11ccf;
  }
  last_out_location = 0;
  if (stage != FRAGMENT) {
    this_00 = pVVar1;
    last_out_location = TestBase::getLastOutputLocation((TestBase *)this,stage,vector_type,GVar2);
  }
  if (SCALAR_SCALAR_SCALAR_SCALAR < test_case->m_layout) goto LAB_0089e281;
  ppcVar7 = &local_e0;
  local_390 = local_148;
  local_3a0 = &local_150;
  local_398 = local_158;
  ppcVar5 = &local_160;
  puVar13 = local_168;
  ppGVar14 = &local_170;
  pGVar11 = local_178;
  ppGVar4 = &local_180;
  pGVar6 = local_188;
  ppGVar10 = &local_190;
  switch(test_case->m_layout) {
  case GVEC4:
    ppcVar7 = &local_1a0;
    local_390 = local_1a8;
    local_3a0 = &local_1b0;
    local_398 = local_1b8;
    ppcVar5 = &local_1c0;
    puVar13 = local_1c8;
    ppGVar14 = &local_1f8.m_name;
    pGVar11 = &local_1f8.m_n_rows;
    ppGVar4 = &local_1f8.m_location_str;
    pGVar6 = &local_1f8.m_location;
    uVar9 = 0;
    pcVar8 = "comp_x";
    GVar2 = 4;
    pcVar3 = "gvec4";
    ppGVar10 = &local_1f8.m_component_str;
    lVar12 = 2;
    break;
  case SCALAR_GVEC3:
    uVar9 = 1;
    pcVar8 = "comp_y";
    GVar2 = 3;
    pcVar3 = "gvec3";
    local_1f8.m_n_rows = 1;
    local_1f8.m_name = "scalar";
    local_1a8[0] = 1;
    local_1a0 = "scalar";
    goto LAB_0089dca0;
  case GVEC3_SCALAR:
    uVar9 = 3;
    pcVar8 = "comp_w";
    GVar2 = 1;
    pcVar3 = "scalar";
    local_1f8.m_n_rows = 3;
    local_1f8.m_name = "gvec3";
    local_1a8[0] = 3;
    local_1a0 = "gvec3";
LAB_0089dca0:
    local_1b0 = "last_output_location";
    local_1c0 = "comp_x";
    local_1c8[0] = 0;
    local_1f8.m_location_str = "first_output_location";
    local_1f8.m_location = 0;
    local_1f8.m_component_str = "comp_x";
    ppcVar7 = &local_140;
    lVar12 = 4;
    local_1b8[0] = last_out_location;
    local_198 = uVar9;
    break;
  case GVEC2_GVEC2:
    local_1f8.m_n_rows = 2;
    local_1f8.m_name = "gvec2";
    ppcVar7 = &local_140;
    local_1a8[0] = 2;
    local_1a0 = "gvec2";
    local_198 = 2;
    lVar12 = 4;
    goto LAB_0089e19d;
  case GVEC2_SCALAR_SCALAR:
    local_1f8.m_n_rows = 2;
    local_1f8.m_name = "gvec2";
    local_1a8[0] = 2;
    local_1a0 = "gvec2";
    local_198 = 2;
    local_190 = "comp_z";
    local_178[0] = 1;
    local_170 = "scalar";
    local_168[0] = 2;
    local_160 = "comp_z";
    local_148[0] = 1;
    local_140 = "scalar";
    goto LAB_0089decc;
  case SCALAR_GVEC2_SCALAR:
    local_1f8.m_n_rows = 1;
    local_1f8.m_name = "scalar";
    local_1a8[0] = 1;
    local_1a0 = "scalar";
    local_198 = 1;
    local_190 = "comp_y";
    local_178[0] = 2;
    local_170 = "gvec2";
    local_168[0] = 1;
    local_160 = "comp_y";
    local_148[0] = 2;
    local_140 = "gvec2";
LAB_0089decc:
    local_150 = "last_output_location";
    local_180 = "first_output_location";
    local_188[0] = 0;
    local_1b0 = "last_output_location";
    local_1c0 = "comp_x";
    local_1c8[0] = 0;
    local_1f8.m_location_str = "first_output_location";
    local_1f8.m_location = 0;
    local_1f8.m_component_str = "comp_x";
    uVar9 = 3;
    pcVar8 = "comp_w";
    pcVar3 = "scalar";
    GVar2 = 1;
    local_138 = 3;
    ppGVar10 = &local_130;
    pGVar6 = local_128;
    ppGVar4 = &local_120;
    ppGVar14 = &local_110;
    puVar13 = local_108;
    ppcVar5 = &local_100;
    local_398 = local_f8;
    local_3a0 = &local_f0;
    local_390 = local_e8;
    lVar12 = 6;
    pGVar11 = local_118;
    local_1b8[0] = last_out_location;
    local_158[0] = last_out_location;
    break;
  case SCALAR_SCALAR_GVEC2:
    local_1f8.m_n_rows = 1;
    local_1f8.m_name = "scalar";
    local_1a8[0] = 1;
    local_1a0 = "scalar";
    local_198 = 1;
    local_190 = "comp_y";
    local_188[0] = 0;
    local_180 = "first_output_location";
    local_178[0] = 1;
    local_170 = "scalar";
    local_168[0] = 1;
    local_160 = "comp_y";
    local_150 = "last_output_location";
    local_148[0] = 1;
    local_140 = "scalar";
    local_138 = 2;
    lVar12 = 6;
    ppGVar10 = &local_130;
    pGVar6 = local_128;
    ppGVar4 = &local_120;
    ppGVar14 = &local_110;
    puVar13 = local_108;
    ppcVar5 = &local_100;
    local_398 = local_f8;
    local_3a0 = &local_f0;
    local_390 = local_e8;
    pGVar11 = local_118;
    local_158[0] = last_out_location;
LAB_0089e19d:
    local_1b0 = "last_output_location";
    local_1c0 = "comp_x";
    local_1c8[0] = 0;
    local_1f8.m_location_str = "first_output_location";
    local_1f8.m_location = 0;
    local_1f8.m_component_str = "comp_x";
    pcVar8 = "comp_z";
    pcVar3 = "gvec2";
    GVar2 = 2;
    uVar9 = 2;
    local_1b8[0] = last_out_location;
    break;
  case SCALAR_SCALAR_SCALAR_SCALAR:
    ppcVar7 = local_80;
    local_390 = local_88;
    local_3a0 = &local_90;
    local_398 = local_98;
    GVar2 = 1;
    pcVar3 = "scalar";
    uVar9 = 3;
    pcVar8 = "comp_w";
    ppGVar10 = &local_d0;
    local_1f8.m_component_str = "comp_x";
    local_1f8.m_location = 0;
    local_1f8.m_location_str = "first_output_location";
    local_1f8.m_n_rows = 1;
    local_1f8.m_name = "scalar";
    local_1c8[0] = 0;
    local_1c0 = "comp_x";
    local_1b0 = "last_output_location";
    local_1a8[0] = 1;
    local_1a0 = "scalar";
    local_198 = 1;
    local_190 = "comp_y";
    local_188[0] = 0;
    local_180 = "first_output_location";
    local_178[0] = 1;
    local_170 = "scalar";
    local_168[0] = 1;
    local_160 = "comp_y";
    ppcVar5 = &local_a0;
    local_150 = "last_output_location";
    local_148[0] = 1;
    local_140 = "scalar";
    local_138 = 2;
    local_130 = "comp_z";
    local_128[0] = 0;
    puVar13 = local_a8;
    local_120 = "first_output_location";
    ppGVar14 = &local_b0;
    local_118[0] = 1;
    local_110 = "scalar";
    local_108[0] = 2;
    local_100 = "comp_z";
    ppGVar4 = &local_c0;
    local_f0 = "last_output_location";
    pGVar6 = local_c8;
    local_e8[0] = 1;
    local_e0 = "scalar";
    local_d8 = 3;
    lVar12 = 8;
    pGVar11 = local_b8;
    local_1b8[0] = last_out_location;
    local_158[0] = last_out_location;
    local_f8[0] = last_out_location;
  }
  local_1f8.m_component = 0;
  *ppGVar10 = pcVar8;
  *pGVar6 = 0;
  *ppGVar4 = "first_output_location";
  *pGVar11 = GVar2;
  *ppGVar14 = pcVar3;
  *puVar13 = uVar9;
  *ppcVar5 = pcVar8;
  *local_398 = last_out_location;
  *local_3a0 = "last_output_location";
  *local_390 = GVar2;
  *ppcVar7 = pcVar3;
  desc = &local_1f8;
  do {
    desc_00 = desc_00 + 1;
    this_00 = (VaryingComponentsTest *)&stack0xffffffffffffffa0;
    in = prepareVarying(this,(Type *)&stack0xffffffffffffffa0,desc_00,local_70,si,stage,
                        VARYING_INPUT);
    if (stage != FRAGMENT) {
      out = prepareVarying(this,(Type *)&stack0xffffffffffffffa0,desc,local_70,si,stage,
                           VARYING_OUTPUT);
      this_00 = pVVar1;
      Utils::VaryingPassthrough::Add(local_68,stage,in,out);
    }
    desc = desc + 1;
    lVar12 = lVar12 + -1;
  } while (lVar12 != 0);
LAB_0089e281:
  prepareGlobals_abi_cxx11_
            ((string *)&stack0xffffffffffffffb0,this_00,last_in_location,last_out_location);
  std::__cxx11::string::operator=((string *)si,(string *)&stack0xffffffffffffffb0);
  if (local_50._M_p != (pointer)&stack0xffffffffffffffc0) {
    operator_delete(local_50._M_p,local_40 + 1);
  }
  return;
}

Assistant:

void VaryingComponentsTest::prepareShaderStage(Utils::Shader::STAGES stage, const Utils::Type& vector_type,
											   Utils::ProgramInterface& program_interface, const testCase& test_case,
											   Utils::VaryingPassthrough& varying_passthrough)
{
	const GLuint			array_length = getArrayLength();
	const Utils::Type&		basic_type = Utils::Type::GetType(vector_type.m_basic_type, 1 /* n_cols */, 1 /* n_rows */);
	descriptor				desc_in[8];
	descriptor				desc_out[8];
	const GLuint			first_in_loc  = 0;
	const GLuint			first_out_loc = 0;
	const GLchar*			interpolation = "";
	const GLuint			last_in_loc   = getLastInputLocation(stage, vector_type, array_length);
	GLuint					last_out_loc  = 0;
	GLuint					n_desc		  = 0;
	Utils::ShaderInterface& si			  = program_interface.GetShaderInterface(stage);

	/* Select interpolation */
	if ((Utils::Shader::FRAGMENT == stage) || (Utils::Shader::GEOMETRY == stage))
	{
		interpolation = " flat";
	}

	if (Utils::Shader::FRAGMENT != stage)
	{
		last_out_loc = getLastOutputLocation(stage, vector_type, array_length);
	}

	switch (test_case.m_layout)
	{
	case GVEC4:
		n_desc = 2;
		desc_in[0].assign(0, "comp_x", first_in_loc, "first_input_location", 4, "gvec4");
		desc_in[1].assign(0, "comp_x", last_in_loc, "last_input_location", 4, "gvec4");

		desc_out[0].assign(0, "comp_x", first_out_loc, "first_output_location", 4, "gvec4");
		desc_out[1].assign(0, "comp_x", last_out_loc, "last_output_location", 4, "gvec4");
		break;
	case SCALAR_GVEC3:
		n_desc = 4;
		desc_in[0].assign(0, "comp_x", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[1].assign(0, "comp_x", last_in_loc, "last_input_location", 1, "scalar");
		desc_in[2].assign(1, "comp_y", first_in_loc, "first_input_location", 3, "gvec3");
		desc_in[3].assign(1, "comp_y", last_in_loc, "last_input_location", 3, "gvec3");

		desc_out[0].assign(0, "comp_x", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[1].assign(0, "comp_x", last_out_loc, "last_output_location", 1, "scalar");
		desc_out[2].assign(1, "comp_y", first_out_loc, "first_output_location", 3, "gvec3");
		desc_out[3].assign(1, "comp_y", last_out_loc, "last_output_location", 3, "gvec3");
		break;
	case GVEC3_SCALAR:
		n_desc = 4;
		desc_in[0].assign(0, "comp_x", first_in_loc, "first_input_location", 3, "gvec3");
		desc_in[1].assign(0, "comp_x", last_in_loc, "last_input_location", 3, "gvec3");
		desc_in[2].assign(3, "comp_w", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[3].assign(3, "comp_w", last_in_loc, "last_input_location", 1, "scalar");

		desc_out[0].assign(0, "comp_x", first_out_loc, "first_output_location", 3, "gvec3");
		desc_out[1].assign(0, "comp_x", last_out_loc, "last_output_location", 3, "gvec3");
		desc_out[2].assign(3, "comp_w", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[3].assign(3, "comp_w", last_out_loc, "last_output_location", 1, "scalar");
		break;
	case GVEC2_GVEC2:
		n_desc = 4;
		desc_in[0].assign(0, "comp_x", first_in_loc, "first_input_location", 2, "gvec2");
		desc_in[1].assign(0, "comp_x", last_in_loc, "last_input_location", 2, "gvec2");
		desc_in[2].assign(2, "comp_z", first_in_loc, "first_input_location", 2, "gvec2");
		desc_in[3].assign(2, "comp_z", last_in_loc, "last_input_location", 2, "gvec2");

		desc_out[0].assign(0, "comp_x", first_out_loc, "first_output_location", 2, "gvec2");
		desc_out[1].assign(0, "comp_x", last_out_loc, "last_output_location", 2, "gvec2");
		desc_out[2].assign(2, "comp_z", first_out_loc, "first_output_location", 2, "gvec2");
		desc_out[3].assign(2, "comp_z", last_out_loc, "last_output_location", 2, "gvec2");
		break;
	case GVEC2_SCALAR_SCALAR:
		n_desc = 6;
		desc_in[0].assign(0, "comp_x", first_in_loc, "first_input_location", 2, "gvec2");
		desc_in[1].assign(0, "comp_x", last_in_loc, "last_input_location", 2, "gvec2");
		desc_in[2].assign(2, "comp_z", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[3].assign(2, "comp_z", last_in_loc, "last_input_location", 1, "scalar");
		desc_in[4].assign(3, "comp_w", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[5].assign(3, "comp_w", last_in_loc, "last_input_location", 1, "scalar");

		desc_out[0].assign(0, "comp_x", first_out_loc, "first_output_location", 2, "gvec2");
		desc_out[1].assign(0, "comp_x", last_out_loc, "last_output_location", 2, "gvec2");
		desc_out[2].assign(2, "comp_z", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[3].assign(2, "comp_z", last_out_loc, "last_output_location", 1, "scalar");
		desc_out[4].assign(3, "comp_w", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[5].assign(3, "comp_w", last_out_loc, "last_output_location", 1, "scalar");
		break;
	case SCALAR_GVEC2_SCALAR:
		n_desc = 6;
		desc_in[0].assign(0, "comp_x", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[1].assign(0, "comp_x", last_in_loc, "last_input_location", 1, "scalar");
		desc_in[2].assign(1, "comp_y", first_in_loc, "first_input_location", 2, "gvec2");
		desc_in[3].assign(1, "comp_y", last_in_loc, "last_input_location", 2, "gvec2");
		desc_in[4].assign(3, "comp_w", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[5].assign(3, "comp_w", last_in_loc, "last_input_location", 1, "scalar");

		desc_out[0].assign(0, "comp_x", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[1].assign(0, "comp_x", last_out_loc, "last_output_location", 1, "scalar");
		desc_out[2].assign(1, "comp_y", first_out_loc, "first_output_location", 2, "gvec2");
		desc_out[3].assign(1, "comp_y", last_out_loc, "last_output_location", 2, "gvec2");
		desc_out[4].assign(3, "comp_w", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[5].assign(3, "comp_w", last_out_loc, "last_output_location", 1, "scalar");
		break;
	case SCALAR_SCALAR_GVEC2:
		n_desc = 6;
		desc_in[0].assign(0, "comp_x", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[1].assign(0, "comp_x", last_in_loc, "last_input_location", 1, "scalar");
		desc_in[2].assign(1, "comp_y", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[3].assign(1, "comp_y", last_in_loc, "last_input_location", 1, "scalar");
		desc_in[4].assign(2, "comp_z", first_in_loc, "first_input_location", 2, "gvec2");
		desc_in[5].assign(2, "comp_z", last_in_loc, "last_input_location", 2, "gvec2");

		desc_out[0].assign(0, "comp_x", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[1].assign(0, "comp_x", last_out_loc, "last_output_location", 1, "scalar");
		desc_out[2].assign(1, "comp_y", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[3].assign(1, "comp_y", last_out_loc, "last_output_location", 1, "scalar");
		desc_out[4].assign(2, "comp_z", first_out_loc, "first_output_location", 2, "gvec2");
		desc_out[5].assign(2, "comp_z", last_out_loc, "last_output_location", 2, "gvec2");
		break;
	case SCALAR_SCALAR_SCALAR_SCALAR:
		n_desc = 8;
		desc_in[0].assign(0, "comp_x", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[1].assign(0, "comp_x", last_in_loc, "last_input_location", 1, "scalar");
		desc_in[2].assign(1, "comp_y", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[3].assign(1, "comp_y", last_in_loc, "last_input_location", 1, "scalar");
		desc_in[4].assign(2, "comp_z", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[5].assign(2, "comp_z", last_in_loc, "last_input_location", 1, "scalar");
		desc_in[6].assign(3, "comp_w", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[7].assign(3, "comp_w", last_in_loc, "last_input_location", 1, "scalar");

		desc_out[0].assign(0, "comp_x", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[1].assign(0, "comp_x", last_out_loc, "last_output_location", 1, "scalar");
		desc_out[2].assign(1, "comp_y", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[3].assign(1, "comp_y", last_out_loc, "last_output_location", 1, "scalar");
		desc_out[4].assign(2, "comp_z", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[5].assign(2, "comp_z", last_out_loc, "last_output_location", 1, "scalar");
		desc_out[6].assign(3, "comp_w", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[7].assign(3, "comp_w", last_out_loc, "last_output_location", 1, "scalar");
		break;
	}

	for (GLuint i = 0; i < n_desc; ++i)
	{
		const descriptor& in_desc = desc_in[i];

		Utils::Variable* in =
			prepareVarying(basic_type, in_desc, interpolation, si, stage, Utils::Variable::VARYING_INPUT);

		if (Utils::Shader::FRAGMENT != stage)
		{
			const descriptor& out_desc = desc_out[i];

			Utils::Variable* out =
				prepareVarying(basic_type, out_desc, interpolation, si, stage, Utils::Variable::VARYING_OUTPUT);

			varying_passthrough.Add(stage, in, out);
		}
	}

	si.m_globals = prepareGlobals(last_in_loc, last_out_loc);
}